

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall r_exec::TDecompiler::runDecompiler(TDecompiler *this)

{
  int iVar1;
  thread *this_00;
  TDecompiler *local_60;
  code *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (this->metadata == (Metadata *)0x0) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"tdecompiler","");
    local_58 = (code *)local_48;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_58,local_50);
    if (local_58 != (code *)local_48) {
      operator_delete(local_58);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"unable to run without metadata",0x1e);
    DebugStream::~DebugStream((DebugStream *)&local_60);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  else {
    this_00 = (thread *)operator_new(8);
    local_58 = decompile;
    local_50 = 0;
    local_60 = this;
    std::thread::thread<void(r_exec::TDecompiler::*)(),r_exec::TDecompiler*,void>
              (this_00,(offset_in_TDecompiler_to_subr *)&local_58,&local_60);
    this->_thread = this_00;
  }
  return;
}

Assistant:

void TDecompiler::runDecompiler()
{
    if (!metadata) {
        debug("tdecompiler") << "unable to run without metadata";
        return;
    }

    _thread = new std::thread(&r_exec::TDecompiler::decompile, this);
}